

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int make_substreamsInfo(archive_write *a,coder *coders)

{
  void *pvVar1;
  ssize_t sVar2;
  undefined1 local_38 [4];
  int local_34;
  uint8_t crc [4];
  int r;
  file *file;
  _7zip_conflict *zip;
  coder *coders_local;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  local_34 = enc_uint64(a,8);
  a_local._4_4_ = local_34;
  if (-1 < local_34) {
    if ((1 < *(ulong *)((long)pvVar1 + 0x20)) && (coders->codec != 0)) {
      local_34 = enc_uint64(a,0xd);
      if (local_34 < 0) {
        return local_34;
      }
      local_34 = enc_uint64(a,*(uint64_t *)((long)pvVar1 + 0x20));
      if (local_34 < 0) {
        return local_34;
      }
      local_34 = enc_uint64(a,9);
      if (local_34 < 0) {
        return local_34;
      }
      _crc = *(long *)((long)pvVar1 + 0xf110);
      while (((_crc != 0 && (*(long *)(_crc + 0x18) != 0)) &&
             (*(long *)(*(long *)(_crc + 0x18) + 0x30) != 0))) {
        local_34 = enc_uint64(a,*(uint64_t *)(_crc + 0x30));
        if (local_34 < 0) {
          return local_34;
        }
        _crc = *(long *)(_crc + 0x18);
      }
    }
    local_34 = enc_uint64(a,10);
    a_local._4_4_ = local_34;
    if ((-1 < local_34) && (local_34 = enc_uint64(a,1), a_local._4_4_ = local_34, -1 < local_34)) {
      for (_crc = *(long *)((long)pvVar1 + 0xf110); (_crc != 0 && (*(long *)(_crc + 0x30) != 0));
          _crc = *(long *)(_crc + 0x18)) {
        archive_le32enc(local_38,*(uint32_t *)(_crc + 0x74));
        sVar2 = compress_out(a,local_38,4,ARCHIVE_Z_RUN);
        local_34 = (int)sVar2;
        if (local_34 < 0) {
          return local_34;
        }
      }
      a_local._4_4_ = enc_uint64(a,0);
      if (-1 < a_local._4_4_) {
        a_local._4_4_ = 0;
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
make_substreamsInfo(struct archive_write *a, struct coder *coders)
{
	struct _7zip *zip = (struct _7zip *)a->format_data;
	struct file *file;
	int r;

	/*
	 * Make SubStreamsInfo.
	 */
	r = enc_uint64(a, kSubStreamsInfo);
	if (r < 0)
		return (r);

	if (zip->total_number_nonempty_entry > 1 && coders->codec != _7Z_COPY) {
		/*
		 * Make NumUnPackStream.
		 */
		r = enc_uint64(a, kNumUnPackStream);
		if (r < 0)
			return (r);

		/* Write numUnpackStreams */
		r = enc_uint64(a, zip->total_number_nonempty_entry);
		if (r < 0)
			return (r);

		/*
		 * Make kSize.
		 */
		r = enc_uint64(a, kSize);
		if (r < 0)
			return (r);
		file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->next == NULL ||
			    file->next->size == 0)
				break;
			r = enc_uint64(a, file->size);
			if (r < 0)
				return (r);
		}
	}

	/*
	 * Make CRC.
	 */
	r = enc_uint64(a, kCRC);
	if (r < 0)
		return (r);


	/* All are defined */
	r = enc_uint64(a, 1);
	if (r < 0)
		return (r);
	file = zip->file_list.first;
	for (;file != NULL; file = file->next) {
		uint8_t crc[4];
		if (file->size == 0)
			break;
		archive_le32enc(crc, file->crc32);
		r = (int)compress_out(a, crc, 4, ARCHIVE_Z_RUN);
		if (r < 0)
			return (r);
	}

	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);
	return (ARCHIVE_OK);
}